

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_visitor.cpp
# Opt level: O3

void __thiscall interpreter_visitor::visit(interpreter_visitor *this,Assignment *ptr)

{
  int *piVar1;
  string *psVar2;
  
  (**(ptr->lvalue->super_Base)._vptr_Base)(ptr->lvalue,this);
  piVar1 = this->lvalue;
  if (piVar1 != (int *)0x0) {
    (**(ptr->rvalue->super_Base)._vptr_Base)(ptr->rvalue,this);
    *piVar1 = this->result;
    return;
  }
  psVar2 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar2,"bad lvalue","");
  __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void interpreter_visitor::visit(Assignment* ptr) {

    ptr->lvalue->accept(this);
    if (lvalue == nullptr)
        throw std::string("bad lvalue");
    auto val_ptr = lvalue;
    ptr->rvalue->accept(this);
    *val_ptr = result;
}